

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O1

bool spdlog::details::os::is_color_terminal(void)

{
  undefined1 uVar1;
  char *env_p;
  char *local_8;
  
  local_8 = ::getenv("TERM");
  if (local_8 == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = is_color_terminal::result;
    if (is_color_terminal()::result == '\0') {
      is_color_terminal((os *)&local_8);
      uVar1 = is_color_terminal::result;
    }
  }
  return (bool)uVar1;
}

Assistant:

SPDLOG_INLINE bool is_color_terminal() SPDLOG_NOEXCEPT
{
#ifdef _WIN32
    return true;
#else
    static constexpr std::array<const char *, 14> terms = {
        {"ansi", "color", "console", "cygwin", "gnome", "konsole", "kterm", "linux", "msys", "putty", "rxvt", "screen", "vt100", "xterm"}};

    const char *env_p = std::getenv("TERM");
    if (env_p == nullptr)
    {
        return false;
    }

    static const bool result =
        std::any_of(terms.begin(), terms.end(), [&](const char *term) { return std::strstr(env_p, term) != nullptr; });
    return result;
#endif
}